

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  stbi__uint32 sVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar24;
  int iVar25;
  long lVar26;
  byte *pbVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  stbi_uc *__dest;
  bool bVar31;
  stbi_uc *local_100;
  long local_e0;
  ulong uVar23;
  
  psVar2 = a->s;
  uVar21 = x * out_n;
  uVar23 = (ulong)uVar21;
  uVar1 = psVar2->img_n;
  psVar9 = (stbi_uc *)malloc((ulong)(uVar21 * y));
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar5 = uVar1 * x;
  uVar22 = uVar5 * depth + 7 >> 3;
  uVar6 = (uVar22 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar6 == raw_len) {
LAB_001111c4:
      lVar11 = -uVar23;
      uVar7 = 0;
      uVar6 = uVar21 - uVar22;
      if (7 < depth) {
        uVar6 = 0;
      }
      sVar8 = x;
      uVar30 = uVar1;
      if (depth < 8) {
        uVar30 = 1;
        sVar8 = uVar22;
      }
      lVar26 = (long)out_n;
      uVar18 = (sVar8 - 1) * uVar1;
      uVar12 = 0;
      if (0 < (int)uVar30) {
        uVar12 = (ulong)uVar30;
      }
      uVar17 = 0;
      if (0 < (int)uVar1) {
        uVar17 = (ulong)uVar1;
      }
      uVar19 = 0;
      if (0 < (int)uVar18) {
        uVar19 = (ulong)uVar18;
      }
      lVar28 = -lVar26;
      lVar14 = -(long)(int)uVar30;
      uVar24 = 0;
      do {
        if (uVar24 == y) {
          if (depth < 8) {
            uVar6 = 0;
            for (uVar12 = 0; uVar12 != y; uVar12 = uVar12 + 1) {
              bVar4 = 1;
              if (color == 0) {
                bVar4 = ""[(uint)depth];
              }
              uVar19 = (ulong)uVar6;
              psVar9 = a->out;
              uVar17 = (ulong)(uVar21 * (int)uVar12);
              if (depth == 4) {
                lVar11 = (uVar23 - uVar22) + uVar19;
                lVar26 = 0;
                for (uVar7 = uVar5; 1 < (int)uVar7; uVar7 = uVar7 - 2) {
                  psVar9[lVar26 * 2 + uVar19] = (psVar9[lVar26 + lVar11] >> 4) * bVar4;
                  psVar9[lVar26 * 2 + uVar19 + 1] = (psVar9[lVar26 + lVar11] & 0xf) * bVar4;
                  lVar26 = lVar26 + 1;
                }
                if (uVar7 == 1) {
                  psVar9[lVar26 * 2 + uVar19] = (psVar9[lVar26 + lVar11] >> 4) * bVar4;
                }
              }
              else {
                pbVar27 = psVar9 + ((uVar17 + uVar23) - (ulong)uVar22);
                if (depth == 2) {
                  psVar9 = psVar9 + uVar19 + 3;
                  for (uVar7 = uVar5; 3 < (int)uVar7; uVar7 = uVar7 - 4) {
                    psVar9[-3] = (*pbVar27 >> 6) * bVar4;
                    psVar9[-2] = (*pbVar27 >> 4 & 3) * bVar4;
                    psVar9[-1] = (*pbVar27 >> 2 & 3) * bVar4;
                    *psVar9 = (*pbVar27 & 3) * bVar4;
                    pbVar27 = pbVar27 + 1;
                    psVar9 = psVar9 + 4;
                  }
                  if (((0 < (int)uVar7) && (psVar9[-3] = (*pbVar27 >> 6) * bVar4, uVar7 != 1)) &&
                     (psVar9[-2] = (*pbVar27 >> 4 & 3) * bVar4, uVar7 == 3)) {
                    psVar9[-1] = (*pbVar27 >> 2 & 3) * bVar4;
                  }
                }
                else if (depth == 1) {
                  pbVar10 = psVar9 + uVar19 + 7;
                  for (uVar7 = uVar5; 7 < (int)uVar7; uVar7 = uVar7 - 8) {
                    pbVar10[-7] = (char)*pbVar27 >> 7 & bVar4;
                    pbVar10[-6] = (char)(*pbVar27 * '\x02') >> 7 & bVar4;
                    pbVar10[-5] = (char)(*pbVar27 << 2) >> 7 & bVar4;
                    pbVar10[-4] = (char)(*pbVar27 << 3) >> 7 & bVar4;
                    pbVar10[-3] = (char)(*pbVar27 << 4) >> 7 & bVar4;
                    pbVar10[-2] = (char)(*pbVar27 << 5) >> 7 & bVar4;
                    pbVar10[-1] = (char)(*pbVar27 << 6) >> 7 & bVar4;
                    bVar20 = bVar4;
                    if ((*pbVar27 & 1) == 0) {
                      bVar20 = 0;
                    }
                    *pbVar10 = bVar20;
                    pbVar27 = pbVar27 + 1;
                    pbVar10 = pbVar10 + 8;
                  }
                  if (((((0 < (int)uVar7) && (pbVar10[-7] = (char)*pbVar27 >> 7 & bVar4, uVar7 != 1)
                        ) && ((pbVar10[-6] = (char)(*pbVar27 * '\x02') >> 7 & bVar4, 2 < uVar7 &&
                              ((pbVar10[-5] = (char)(*pbVar27 << 2) >> 7 & bVar4, uVar7 != 3 &&
                               (pbVar10[-4] = (char)(*pbVar27 << 3) >> 7 & bVar4, 4 < uVar7)))))) &&
                      (pbVar10[-3] = (char)(*pbVar27 << 4) >> 7 & bVar4, uVar7 != 5)) &&
                     (pbVar10[-2] = (char)(*pbVar27 << 5) >> 7 & bVar4, uVar7 == 7)) {
                    pbVar10[-1] = (char)(*pbVar27 << 6) >> 7 & bVar4;
                  }
                }
              }
              if (uVar1 != out_n) {
                psVar9 = a->out;
                iVar25 = x - 1;
                uVar7 = x * 4;
                uVar30 = x * 3;
                if (uVar1 == 1) {
                  uVar7 = x * 2 - 1;
                  for (iVar25 = 0; -1 < (int)((x - 1) + iVar25); iVar25 = iVar25 + -1) {
                    psVar9[uVar7 + uVar17] = 0xff;
                    psVar9[(uVar7 - 1) + uVar17] = psVar9[((x - 1) + iVar25 & 0x7fffffff) + uVar17];
                    uVar7 = uVar7 - 2;
                  }
                }
                else {
                  while( true ) {
                    uVar30 = uVar30 - 3;
                    if (iVar25 < 0) break;
                    psVar9[(uVar7 - 1) + uVar17] = 0xff;
                    psVar9[(uVar7 - 2) + uVar17] = psVar9[(ulong)uVar30 + uVar17 + 2];
                    psVar9[(uVar7 - 3) + uVar17] = psVar9[(ulong)uVar30 + uVar17 + 1];
                    psVar9[(uVar7 - 4) + uVar17] = psVar9[uVar30 + uVar17];
                    iVar25 = iVar25 + -1;
                    uVar7 = uVar7 - 4;
                  }
                }
              }
              uVar6 = uVar6 + uVar21;
            }
          }
          return 1;
        }
        uVar13 = (ulong)*raw;
        if (4 < uVar13) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
        if (uVar24 == 0) {
          uVar13 = (ulong)""[uVar13];
        }
        uVar15 = (ulong)uVar7;
        psVar9 = a->out;
        uVar30 = uVar21 * (int)uVar24;
        lVar16 = uVar15 + lVar11;
        for (uVar29 = 0; uVar12 != uVar29; uVar29 = uVar29 + 1) {
          switch(uVar13) {
          case 0:
          case 1:
          case 5:
          case 6:
            bVar4 = raw[uVar29 + 1];
            break;
          case 2:
            bVar4 = psVar9[uVar29 + lVar16];
            goto LAB_001113b9;
          case 3:
            bVar4 = psVar9[uVar29 + lVar16] >> 1;
LAB_001113b9:
            bVar4 = bVar4 + raw[uVar29 + 1];
            break;
          case 4:
            bVar4 = raw[uVar29 + 1];
            iVar25 = stbi__paeth(0,(uint)psVar9[uVar29 + lVar16],0);
            bVar4 = (char)iVar25 + bVar4;
            break;
          default:
            goto switchD_0011136d_default;
          }
          psVar9[uVar29 + uVar15 + uVar6] = bVar4;
switchD_0011136d_default:
        }
        if (depth == 8) {
          if (uVar1 != out_n) {
            psVar9[(long)(int)uVar1 + (ulong)uVar30] = 0xff;
          }
          raw = raw + (long)(int)uVar1 + 1;
          lVar3 = lVar26 + (ulong)uVar30;
          lVar16 = lVar26;
        }
        else {
          raw = raw + 2;
          lVar3 = (ulong)uVar6 + (ulong)uVar30 + 1;
          lVar16 = 1;
        }
        __dest = psVar9 + lVar3;
        if (uVar1 == out_n || depth < 8) {
          switch(uVar13) {
          case 0:
            memcpy(__dest,raw,(long)(int)uVar18);
            break;
          case 1:
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              __dest[uVar13] = __dest[uVar13 + lVar14] + raw[uVar13];
            }
            break;
          case 2:
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              __dest[uVar13] = psVar9[uVar13 + lVar16 + uVar15 + lVar11] + raw[uVar13];
            }
            break;
          case 3:
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              __dest[uVar13] =
                   (char)((uint)__dest[uVar13 + lVar14] +
                          (uint)psVar9[uVar13 + lVar16 + uVar15 + lVar11] >> 1) + raw[uVar13];
            }
            break;
          case 4:
            pbVar10 = psVar9 + lVar16 + uVar15 + lVar11;
            pbVar27 = raw;
            uVar13 = uVar19;
            while (bVar31 = uVar13 != 0, uVar13 = uVar13 - 1, bVar31) {
              bVar4 = *pbVar27;
              iVar25 = stbi__paeth((uint)__dest[lVar14],(uint)*pbVar10,(uint)pbVar10[lVar14]);
              *__dest = (char)iVar25 + bVar4;
              __dest = __dest + 1;
              pbVar10 = pbVar10 + 1;
              pbVar27 = pbVar27 + 1;
            }
            break;
          case 5:
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              __dest[uVar13] = (__dest[uVar13 + lVar14] >> 1) + raw[uVar13];
            }
            break;
          case 6:
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              __dest[uVar13] = __dest[uVar13 + lVar14] + raw[uVar13];
            }
          }
          raw = raw + (int)uVar18;
        }
        else if ((byte)uVar13 < 7) {
          local_100 = psVar9 + lVar16 + lVar11 + (ulong)uVar30;
          switch(uVar13) {
          case 0:
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                __dest[uVar13] = raw[uVar13];
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
            }
            break;
          case 1:
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                __dest[uVar13] = __dest[uVar13 + lVar28] + raw[uVar13];
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
            }
            break;
          case 2:
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                __dest[uVar13] = local_100[uVar13] + raw[uVar13];
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
              local_100 = local_100 + lVar26;
            }
            break;
          case 3:
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                __dest[uVar13] =
                     (char)((uint)__dest[uVar13 + lVar28] + (uint)local_100[uVar13] >> 1) +
                     raw[uVar13];
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
              local_100 = local_100 + lVar26;
            }
            break;
          case 4:
            local_e0 = (long)__dest + lVar28;
            psVar9 = psVar9 + lVar16 + uVar15 + (lVar28 - uVar23);
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                bVar4 = raw[uVar13];
                iVar25 = stbi__paeth((uint)*(byte *)(local_e0 + uVar13),(uint)local_100[uVar13],
                                     (uint)psVar9[uVar13]);
                __dest[uVar13] = (char)iVar25 + bVar4;
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
              local_100 = local_100 + lVar26;
              local_e0 = local_e0 + lVar26;
              psVar9 = psVar9 + lVar26;
            }
            break;
          case 5:
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                __dest[uVar13] = (__dest[uVar13 + lVar28] >> 1) + raw[uVar13];
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
            }
            break;
          case 6:
            sVar8 = x;
            while (sVar8 = sVar8 - 1, sVar8 != 0) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                __dest[uVar13] = __dest[uVar13 + lVar28] + raw[uVar13];
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar26;
            }
          }
        }
        uVar24 = uVar24 + 1;
        uVar7 = uVar21 + uVar7;
      } while( true );
    }
  }
  else if (uVar6 <= raw_len) goto LAB_001111c4;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}